

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenGlobalInitializer.cxx
# Opt level: O3

void __thiscall
cmQtAutoGenGlobalInitializer::cmQtAutoGenGlobalInitializer
          (cmQtAutoGenGlobalInitializer *this,
          vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
          *localGenerators)

{
  _Rb_tree_header *p_Var1;
  cmMakefile *this_00;
  pointer pcVar2;
  cmLocalGenerator *pcVar3;
  pointer puVar4;
  __uniq_ptr_data<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>,_true,_true> _Var5;
  bool globalAutogenTarget;
  bool globalAutoRccTarget;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  TargetType TVar9;
  string *psVar10;
  const_iterator cVar11;
  string *psVar12;
  string *psVar13;
  cmQtAutoGenInitializer *this_01;
  byte bVar14;
  ulong in_R8;
  pointer puVar15;
  pointer puVar16;
  bool moc;
  bool uic;
  pointer pcVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  undefined1 local_208 [48];
  pair<cmQtAutoGen::IntegerVersion,_unsigned_int> local_1d8;
  string targetName;
  string local_108;
  string local_e8;
  size_type local_c8;
  pointer local_c0;
  string *local_b8;
  string *local_b0;
  string *local_a8;
  pointer local_a0;
  string *local_98;
  string *local_90;
  pointer local_88;
  string msg;
  cmAlphaNum version;
  
  (this->Initializers_).
  super__Vector_base<std::unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>,_std::allocator<std::unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Initializers_).
  super__Vector_base<std::unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>,_std::allocator<std::unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Initializers_).
  super__Vector_base<std::unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>,_std::allocator<std::unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->GlobalAutoGenTargets_)._M_t._M_impl.super__Rb_tree_header;
  (this->GlobalAutoGenTargets_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->GlobalAutoGenTargets_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->GlobalAutoGenTargets_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->GlobalAutoGenTargets_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->GlobalAutoGenTargets_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->GlobalAutoRccTargets_)._M_t._M_impl.super__Rb_tree_header;
  (this->GlobalAutoRccTargets_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->GlobalAutoRccTargets_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->GlobalAutoRccTargets_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->GlobalAutoRccTargets_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->GlobalAutoRccTargets_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->CompilerFeatures_)._M_h._M_buckets = &(this->CompilerFeatures_)._M_h._M_single_bucket;
  (this->CompilerFeatures_)._M_h._M_bucket_count = 1;
  (this->CompilerFeatures_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->CompilerFeatures_)._M_h._M_element_count = 0;
  (this->CompilerFeatures_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->CompilerFeatures_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->CompilerFeatures_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  Keywords::Keywords(&this->Keywords_);
  puVar15 = (localGenerators->
            super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_a0 = (localGenerators->
             super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  if (puVar15 != local_a0) {
    local_90 = &(this->Keywords_).AUTOUIC;
    local_98 = &(this->Keywords_).AUTORCC;
    local_a8 = &(this->Keywords_).AUTOMOC_EXECUTABLE;
    local_b0 = &(this->Keywords_).AUTOUIC_EXECUTABLE;
    local_b8 = &(this->Keywords_).AUTORCC_EXECUTABLE;
    do {
      pcVar17 = local_208 + 0x10;
      this_00 = ((puVar15->_M_t).
                 super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>.
                 super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl)->Makefile;
      targetName._M_dataplus._M_p = (pointer)&targetName.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&targetName,"CMAKE_GLOBAL_AUTOGEN_TARGET","");
      globalAutogenTarget = cmMakefile::IsOn(this_00,&targetName);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)targetName._M_dataplus._M_p != &targetName.field_2) {
        operator_delete(targetName._M_dataplus._M_p,targetName.field_2._M_allocated_capacity + 1);
      }
      if (globalAutogenTarget) {
        local_208._0_8_ = pcVar17;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_208,"CMAKE_GLOBAL_AUTOGEN_TARGET_NAME","");
        psVar10 = cmMakefile::GetSafeDefinition(this_00,(string *)local_208);
        targetName._M_dataplus._M_p = (pointer)&targetName.field_2;
        pcVar2 = (psVar10->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&targetName,pcVar2,pcVar2 + psVar10->_M_string_length);
        if ((pointer)local_208._0_8_ != pcVar17) {
          operator_delete((void *)local_208._0_8_,local_208._16_8_ + 1);
        }
        if (targetName._M_string_length == 0) {
          in_R8 = 7;
          std::__cxx11::string::_M_replace((ulong)&targetName,0,(char *)0x0,0x75d5e5);
        }
        local_208._0_8_ =
             (puVar15->_M_t).
             super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>._M_t.
             super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>.
             super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl;
        std::
        _Rb_tree<cmLocalGenerator*,std::pair<cmLocalGenerator*const,std::__cxx11::string>,std::_Select1st<std::pair<cmLocalGenerator*const,std::__cxx11::string>>,std::less<cmLocalGenerator*>,std::allocator<std::pair<cmLocalGenerator*const,std::__cxx11::string>>>
        ::_M_emplace_unique<cmLocalGenerator*,std::__cxx11::string>
                  ((_Rb_tree<cmLocalGenerator*,std::pair<cmLocalGenerator*const,std::__cxx11::string>,std::_Select1st<std::pair<cmLocalGenerator*const,std::__cxx11::string>>,std::less<cmLocalGenerator*>,std::allocator<std::pair<cmLocalGenerator*const,std::__cxx11::string>>>
                    *)&this->GlobalAutoGenTargets_,(cmLocalGenerator **)local_208,&targetName);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)targetName._M_dataplus._M_p != &targetName.field_2) {
          operator_delete(targetName._M_dataplus._M_p,targetName.field_2._M_allocated_capacity + 1);
        }
      }
      targetName._M_dataplus._M_p = (pointer)&targetName.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&targetName,"CMAKE_GLOBAL_AUTORCC_TARGET","");
      globalAutoRccTarget = cmMakefile::IsOn(this_00,&targetName);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)targetName._M_dataplus._M_p != &targetName.field_2) {
        operator_delete(targetName._M_dataplus._M_p,targetName.field_2._M_allocated_capacity + 1);
      }
      if (globalAutoRccTarget) {
        local_208._0_8_ = pcVar17;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_208,"CMAKE_GLOBAL_AUTORCC_TARGET_NAME","");
        psVar10 = cmMakefile::GetSafeDefinition(this_00,(string *)local_208);
        targetName._M_dataplus._M_p = (pointer)&targetName.field_2;
        pcVar2 = (psVar10->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&targetName,pcVar2,pcVar2 + psVar10->_M_string_length);
        if ((pointer)local_208._0_8_ != pcVar17) {
          operator_delete((void *)local_208._0_8_,local_208._16_8_ + 1);
        }
        if (targetName._M_string_length == 0) {
          in_R8 = 7;
          std::__cxx11::string::_M_replace((ulong)&targetName,0,(char *)0x0,0x75d64e);
        }
        local_208._0_8_ =
             (puVar15->_M_t).
             super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>._M_t.
             super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>.
             super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl;
        std::
        _Rb_tree<cmLocalGenerator*,std::pair<cmLocalGenerator*const,std::__cxx11::string>,std::_Select1st<std::pair<cmLocalGenerator*const,std::__cxx11::string>>,std::less<cmLocalGenerator*>,std::allocator<std::pair<cmLocalGenerator*const,std::__cxx11::string>>>
        ::_M_emplace_unique<cmLocalGenerator*,std::__cxx11::string>
                  ((_Rb_tree<cmLocalGenerator*,std::pair<cmLocalGenerator*const,std::__cxx11::string>,std::_Select1st<std::pair<cmLocalGenerator*const,std::__cxx11::string>>,std::less<cmLocalGenerator*>,std::allocator<std::pair<cmLocalGenerator*const,std::__cxx11::string>>>
                    *)&this->GlobalAutoRccTargets_,(cmLocalGenerator **)local_208,&targetName);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)targetName._M_dataplus._M_p != &targetName.field_2) {
          operator_delete(targetName._M_dataplus._M_p,targetName.field_2._M_allocated_capacity + 1);
        }
      }
      pcVar3 = (puVar15->_M_t).
               super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>._M_t.
               super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>.
               super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl;
      puVar4 = *(pointer *)
                ((long)&(pcVar3->GeneratorTargets).
                        super__Vector_base<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
                + 8);
      local_88 = puVar15;
      for (puVar16 = *(pointer *)
                      &(pcVar3->GeneratorTargets).
                       super__Vector_base<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
                       ._M_impl; puVar16 != puVar4; puVar16 = puVar16 + 1) {
        TVar9 = cmGeneratorTarget::GetType
                          ((cmGeneratorTarget *)
                           (puVar16->_M_t).
                           super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                          );
        if ((TVar9 < UTILITY) &&
           (bVar6 = cmGeneratorTarget::IsImported
                              ((cmGeneratorTarget *)
                               (puVar16->_M_t).
                               super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                              ), !bVar6)) {
          cmGeneratorTarget::GetAllConfigCompileLanguages_abi_cxx11_
                    ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_208,
                     (cmGeneratorTarget *)
                     (puVar16->_M_t).
                     super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                    );
          cmGeneratorTarget::ClearSourcesCache
                    ((cmGeneratorTarget *)
                     (puVar16->_M_t).
                     super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                    );
          targetName._M_dataplus._M_p = (pointer)&targetName.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&targetName,"CSharp","");
          cVar11 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_208,&targetName);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)targetName._M_dataplus._M_p != &targetName.field_2) {
            operator_delete(targetName._M_dataplus._M_p,targetName.field_2._M_allocated_capacity + 1
                           );
          }
          if (cVar11._M_node == (_Base_ptr)(local_208 + 8)) {
            bVar6 = cmGeneratorTarget::GetPropertyAsBool
                              ((cmGeneratorTarget *)
                               (puVar16->_M_t).
                               super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                               ,&(this->Keywords_).AUTOMOC);
            bVar7 = cmGeneratorTarget::GetPropertyAsBool
                              ((cmGeneratorTarget *)
                               (puVar16->_M_t).
                               super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                               ,local_90);
            bVar8 = cmGeneratorTarget::GetPropertyAsBool
                              ((cmGeneratorTarget *)
                               (puVar16->_M_t).
                               super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                               ,local_98);
            if ((bVar6 || bVar7) || bVar8) {
              psVar10 = cmGeneratorTarget::GetSafeProperty
                                  ((cmGeneratorTarget *)
                                   (puVar16->_M_t).
                                   super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                                   ,local_a8);
              psVar12 = cmGeneratorTarget::GetSafeProperty
                                  ((cmGeneratorTarget *)
                                   (puVar16->_M_t).
                                   super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                                   ,local_b0);
              psVar13 = cmGeneratorTarget::GetSafeProperty
                                  ((cmGeneratorTarget *)
                                   (puVar16->_M_t).
                                   super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                                   ,local_b8);
              _Var5.
              super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>._M_t
              .super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>.
              super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl =
                   (puVar16->_M_t).
                   super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
              ;
              local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
              pcVar17 = (psVar10->_M_dataplus)._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_e8,pcVar17,pcVar17 + psVar10->_M_string_length);
              local_1d8 = cmQtAutoGenInitializer::GetQtVersion
                                    ((cmGeneratorTarget *)
                                     _Var5.
                                     super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                                     .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl
                                     ,&local_e8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
                operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1
                               );
              }
              bVar19 = true;
              bVar18 = true;
              bVar20 = true;
              if (2 < local_1d8.first.Major - 4) {
                bVar18 = psVar10->_M_string_length != 0;
                bVar19 = psVar12->_M_string_length != 0;
                bVar20 = psVar13->_M_string_length != 0;
              }
              bVar14 = (bVar18 ^ 1U) & bVar6;
              moc = (bool)((bVar19 ^ 1U) & bVar7);
              uic = (bool)((bVar20 ^ 1U) & bVar8);
              if (((moc != false) || (bVar14 != 0)) || (uic != false)) {
                if (local_1d8.second == 0) {
                  version.View_._M_len = 0xb;
                  version.View_._M_str = "<QTVERSION>";
                }
                else {
                  cmAlphaNum::cmAlphaNum(&version,local_1d8.second);
                }
                psVar10 = cmGeneratorTarget::GetName_abi_cxx11_
                                    ((cmGeneratorTarget *)
                                     (puVar16->_M_t).
                                     super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                                    );
                local_c0 = (psVar10->_M_dataplus)._M_p;
                local_c8 = psVar10->_M_string_length;
                cmQtAutoGen::Tools_abi_cxx11_
                          (&local_108,(cmQtAutoGen *)(ulong)bVar14,moc,uic,SUB81(in_R8,0));
                targetName._M_dataplus._M_p = &DAT_0000002e;
                targetName._M_string_length = (size_type)anon_var_dwarf_b2d23c;
                targetName.field_2._M_allocated_capacity = local_c8;
                targetName.field_2._8_8_ = local_c0;
                views._M_len = 0xb;
                views._M_array = (iterator)&targetName;
                cmCatViews_abi_cxx11_(&msg,views);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_108._M_dataplus._M_p != &local_108.field_2) {
                  operator_delete(local_108._M_dataplus._M_p,
                                  local_108.field_2._M_allocated_capacity + 1);
                }
                cmMakefile::IssueMessage
                          (*(cmMakefile **)
                            ((long)(puVar16->_M_t).
                                   super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                            + 8),AUTHOR_WARNING,&msg);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)msg._M_dataplus._M_p != &msg.field_2) {
                  operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
                }
              }
              bVar6 = (bool)(bVar6 & bVar18);
              if ((byte)(bVar7 & bVar19 | bVar6 | bVar8 & bVar20) == 1) {
                _Var5.
                super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>.
                _M_t.
                super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl =
                     (puVar16->_M_t).
                     super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                ;
                this_01 = (cmQtAutoGenInitializer *)operator_new(0x948);
                in_R8 = (ulong)bVar6;
                cmQtAutoGenInitializer::cmQtAutoGenInitializer
                          (this_01,this,
                           (cmGeneratorTarget *)
                           _Var5.
                           super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                           .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl,
                           &local_1d8.first,bVar6,(bool)(bVar7 & bVar19),(bool)(bVar8 & bVar20),
                           globalAutogenTarget,globalAutoRccTarget);
                targetName._M_dataplus._M_p = (pointer)this_01;
                std::
                vector<std::unique_ptr<cmQtAutoGenInitializer,std::default_delete<cmQtAutoGenInitializer>>,std::allocator<std::unique_ptr<cmQtAutoGenInitializer,std::default_delete<cmQtAutoGenInitializer>>>>
                ::
                emplace_back<std::unique_ptr<cmQtAutoGenInitializer,std::default_delete<cmQtAutoGenInitializer>>>
                          ((vector<std::unique_ptr<cmQtAutoGenInitializer,std::default_delete<cmQtAutoGenInitializer>>,std::allocator<std::unique_ptr<cmQtAutoGenInitializer,std::default_delete<cmQtAutoGenInitializer>>>>
                            *)this,(unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>
                                    *)&targetName);
                std::
                unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>::
                ~unique_ptr((unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>
                             *)&targetName);
              }
            }
          }
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_208);
        }
      }
      puVar15 = local_88 + 1;
    } while (puVar15 != local_a0);
  }
  return;
}

Assistant:

cmQtAutoGenGlobalInitializer::cmQtAutoGenGlobalInitializer(
  std::vector<std::unique_ptr<cmLocalGenerator>> const& localGenerators)
{
  for (const auto& localGen : localGenerators) {
    // Detect global autogen and autorcc target names
    bool globalAutoGenTarget = false;
    bool globalAutoRccTarget = false;
    {
      cmMakefile* makefile = localGen->GetMakefile();
      // Detect global autogen target name
      if (makefile->IsOn("CMAKE_GLOBAL_AUTOGEN_TARGET")) {
        std::string targetName =
          makefile->GetSafeDefinition("CMAKE_GLOBAL_AUTOGEN_TARGET_NAME");
        if (targetName.empty()) {
          targetName = "autogen";
        }
        this->GlobalAutoGenTargets_.emplace(localGen.get(),
                                            std::move(targetName));
        globalAutoGenTarget = true;
      }

      // Detect global autorcc target name
      if (makefile->IsOn("CMAKE_GLOBAL_AUTORCC_TARGET")) {
        std::string targetName =
          makefile->GetSafeDefinition("CMAKE_GLOBAL_AUTORCC_TARGET_NAME");
        if (targetName.empty()) {
          targetName = "autorcc";
        }
        this->GlobalAutoRccTargets_.emplace(localGen.get(),
                                            std::move(targetName));
        globalAutoRccTarget = true;
      }
    }

    // Find targets that require AUTOMOC/UIC/RCC processing
    for (const auto& target : localGen->GetGeneratorTargets()) {
      // Process only certain target types
      switch (target->GetType()) {
        case cmStateEnums::EXECUTABLE:
        case cmStateEnums::STATIC_LIBRARY:
        case cmStateEnums::SHARED_LIBRARY:
        case cmStateEnums::MODULE_LIBRARY:
        case cmStateEnums::OBJECT_LIBRARY:
          // Process target
          break;
        default:
          // Don't process target
          continue;
      }
      if (target->IsImported()) {
        // Don't process target
        continue;
      }
      std::set<std::string> const& languages =
        target->GetAllConfigCompileLanguages();
      // cmGeneratorTarget::GetAllConfigCompileLanguages caches the target's
      // sources. Clear it so that OBJECT library targets that are AUTOGEN
      // initialized after this target get their added mocs_compilation.cpp
      // source acknowledged by this target.
      target->ClearSourcesCache();
      if (languages.count("CSharp")) {
        // Don't process target if it's a CSharp target
        continue;
      }

      bool const moc = target->GetPropertyAsBool(this->kw().AUTOMOC);
      bool const uic = target->GetPropertyAsBool(this->kw().AUTOUIC);
      bool const rcc = target->GetPropertyAsBool(this->kw().AUTORCC);
      if (moc || uic || rcc) {
        std::string const& mocExec =
          target->GetSafeProperty(this->kw().AUTOMOC_EXECUTABLE);
        std::string const& uicExec =
          target->GetSafeProperty(this->kw().AUTOUIC_EXECUTABLE);
        std::string const& rccExec =
          target->GetSafeProperty(this->kw().AUTORCC_EXECUTABLE);

        // We support Qt4, Qt5 and Qt6
        auto qtVersion =
          cmQtAutoGenInitializer::GetQtVersion(target.get(), mocExec);
        bool const validQt = (qtVersion.first.Major == 4) ||
          (qtVersion.first.Major == 5) || (qtVersion.first.Major == 6);

        bool const mocAvailable = (validQt || !mocExec.empty());
        bool const uicAvailable = (validQt || !uicExec.empty());
        bool const rccAvailable = (validQt || !rccExec.empty());
        bool const mocIsValid = (moc && mocAvailable);
        bool const uicIsValid = (uic && uicAvailable);
        bool const rccIsValid = (rcc && rccAvailable);
        // Disabled AUTOMOC/UIC/RCC warning
        bool const mocDisabled = (moc && !mocAvailable);
        bool const uicDisabled = (uic && !uicAvailable);
        bool const rccDisabled = (rcc && !rccAvailable);
        if (mocDisabled || uicDisabled || rccDisabled) {
          cmAlphaNum version = (qtVersion.second == 0)
            ? cmAlphaNum("<QTVERSION>")
            : cmAlphaNum(qtVersion.second);
          cmAlphaNum component = uicDisabled ? "Widgets" : "Core";

          std::string const msg = cmStrCat(
            "AUTOGEN: No valid Qt version found for target ",
            target->GetName(), ".  ",
            cmQtAutoGen::Tools(mocDisabled, uicDisabled, rccDisabled),
            " disabled.  Consider adding:\n", "  find_package(Qt", version,
            " COMPONENTS ", component, ")\n", "to your CMakeLists.txt file.");
          target->Makefile->IssueMessage(MessageType::AUTHOR_WARNING, msg);
        }
        if (mocIsValid || uicIsValid || rccIsValid) {
          // Create autogen target initializer
          this->Initializers_.emplace_back(
            cm::make_unique<cmQtAutoGenInitializer>(
              this, target.get(), qtVersion.first, mocIsValid, uicIsValid,
              rccIsValid, globalAutoGenTarget, globalAutoRccTarget));
        }
      }
    }
  }
}